

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypergraph.cpp
# Opt level: O0

edge_vec * __thiscall
Hypergraph::enumerate_legacy(edge_vec *__return_storage_ptr__,Hypergraph *this)

{
  int iVar1;
  allocator<unsigned_long> local_81;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_80;
  allocator<unsigned_long> local_49;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  rep local_28;
  undefined1 local_19;
  Hypergraph *local_18;
  Hypergraph *this_local;
  edge_vec *minimal_hitting_sets;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Hypergraph *)__return_storage_ptr__;
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(__return_storage_ptr__);
  if (((this->m_configuration).collect_hitting_set_statistics & 1U) != 0) {
    local_28 = std::chrono::_V2::system_clock::now();
    (this->m_hitting_set_timestamp).__d.__r = local_28;
  }
  iVar1 = this->m_num_vertices;
  std::allocator<unsigned_long>::allocator(&local_49);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&local_48,(long)iVar1,0,&local_49);
  iVar1 = this->m_num_vertices;
  std::allocator<unsigned_long>::allocator(&local_81);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&local_80,(long)iVar1,0,&local_81);
  enumerate_legacy(this,&local_48,&local_80,0,__return_storage_ptr__);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset(&local_80);
  std::allocator<unsigned_long>::~allocator(&local_81);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset(&local_48);
  std::allocator<unsigned_long>::~allocator(&local_49);
  return __return_storage_ptr__;
}

Assistant:

edge_vec Hypergraph::enumerate_legacy() {
	edge_vec minimal_hitting_sets;
	if (m_configuration.collect_hitting_set_statistics) m_hitting_set_timestamp = Clock::now();
	enumerate_legacy(edge(m_num_vertices), edge(m_num_vertices), 0, minimal_hitting_sets);
	return minimal_hitting_sets;
}